

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

Token * __thiscall slang::syntax::SyntaxNode::getLastTokenPtr(SyntaxNode *this)

{
  bool bVar1;
  SyntaxNode *this_00;
  SyntaxNode *pSVar2;
  Token *pTVar3;
  Token *result;
  PtrTokenOrSyntax child;
  ptrdiff_t i;
  size_t childCount;
  SyntaxNode *in_stack_ffffffffffffffb8;
  SyntaxNode *in_stack_ffffffffffffffc0;
  SyntaxNode *local_20;
  
  this_00 = (SyntaxNode *)getChildCount(in_stack_ffffffffffffffb8);
  local_20 = this_00;
  while( true ) {
    do {
      while( true ) {
        local_20 = (SyntaxNode *)((long)&local_20[-1].previewNode + 7);
        if ((long)local_20 < 0) {
          return (Token *)0x0;
        }
        in_stack_ffffffffffffffc0 =
             (SyntaxNode *)getChildPtr(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
        bVar1 = PtrTokenOrSyntax::isToken((PtrTokenOrSyntax *)0xc7814b);
        if (!bVar1) break;
        pTVar3 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)0xc7815b);
        if (pTVar3 != (Token *)0x0) {
          pTVar3 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)0xc7816b);
          return pTVar3;
        }
      }
      pSVar2 = PtrTokenOrSyntax::node((PtrTokenOrSyntax *)0xc7817e);
    } while (pSVar2 == (SyntaxNode *)0x0);
    PtrTokenOrSyntax::node((PtrTokenOrSyntax *)0xc7818e);
    pTVar3 = getLastTokenPtr(this_00);
    if (pTVar3 != (Token *)0x0) break;
    in_stack_ffffffffffffffb8 = (SyntaxNode *)0x0;
  }
  return pTVar3;
}

Assistant:

parsing::Token* SyntaxNode::getLastTokenPtr() {
    size_t childCount = getChildCount();
    for (ptrdiff_t i = ptrdiff_t(childCount) - 1; i >= 0; i--) {
        auto child = getChildPtr(size_t(i));
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getLastTokenPtr();
            if (result)
                return result;
        }
    }
    return nullptr;
}